

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day.h
# Opt level: O2

int __thiscall Day::getLessonsNumber(Day *this)

{
  pointer pLVar1;
  long lVar2;
  int iVar3;
  bool *pbVar4;
  bool bVar5;
  
  pLVar1 = (this->lessons).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = ((long)(this->lessons).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pLVar1) / 0xa8;
  pbVar4 = &pLVar1->exist;
  iVar3 = 0;
  while (bVar5 = lVar2 != 0, lVar2 = lVar2 + -1, bVar5) {
    iVar3 = iVar3 + (uint)*pbVar4;
    pbVar4 = pbVar4 + 0xa8;
  }
  return iVar3;
}

Assistant:

int Day::getLessonsNumber() {
    int number = 0;
    for (size_t i = 0; i < lessons.size(); i++) {
        if(lessons[i].exist == true) {
            number++;
        }
    }
    return number;
}